

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

Pattern * __thiscall
trieste::detail::Pattern::operator++(Pattern *__return_storage_ptr__,Pattern *this,int param_1)

{
  element_type *peVar1;
  __shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 in_register_00000014;
  PatternPtr result;
  __shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> _Stack_138;
  __shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> local_118;
  PatternPtr local_108;
  FastPattern local_f0;
  FastPattern local_88;
  
  peVar1 = (this->pattern).
           super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_PatternDef[2])(&local_128,peVar1,CONCAT44(in_register_00000014,param_1));
  if (local_128._M_ptr == (element_type *)0x0) {
    std::make_shared<trieste::detail::Rep,std::shared_ptr<trieste::detail::PatternDef>const&>
              ((shared_ptr<trieste::detail::PatternDef> *)&local_118);
    p_Var2 = &local_118;
    local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_118._M_ptr;
    local_108.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_118._M_refcount._M_pi;
    local_118._M_ptr = (element_type *)0x0;
    local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    FastPattern::match_opt(&local_f0,&this->fast_pattern);
    Pattern(__return_storage_ptr__,&local_108,&local_f0);
    FastPattern::~FastPattern(&local_f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_108.
                super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_138,&local_128);
    FastPattern::match_any();
    Pattern(__return_storage_ptr__,(PatternPtr *)&_Stack_138,&local_88);
    FastPattern::~FastPattern(&local_88);
    p_Var2 = &_Stack_138;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Pattern operator++(int) const
      {
        auto result = pattern->custom_rep();
        if (result)
          // With a custom rep many things can happen.  We overapproximate here.
          // We could do better, but it's not worth the effort.
          return {result, FastPattern::match_any()};

        return {
          std::make_shared<Rep>(pattern), FastPattern::match_opt(fast_pattern)};
      }